

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment.c
# Opt level: O2

char ** apprun_env_item_list_to_envp(apprun_env_item_list_t *list)

{
  apprun_env_item_list_t paVar1;
  uint uVar2;
  char **ppcVar3;
  char *pcVar4;
  apprun_env_item_list_t *itr;
  apprun_env_item_t *item;
  ulong uVar5;
  
  uVar2 = apprun_env_item_list_to_envp_len(list);
  ppcVar3 = (char **)calloc((ulong)(uVar2 + 1),8);
  uVar5 = 0;
  for (; paVar1 = *list, paVar1 != (apprun_env_item_list_t)0x0; list = list + 1) {
    if (paVar1->current_value != (char *)0x0) {
      pcVar4 = apprun_env_envp_entry_create((char *)0x0,paVar1->name,paVar1->current_value);
      ppcVar3[uVar5] = pcVar4;
      uVar5 = (ulong)((int)uVar5 + 1);
    }
    if (paVar1->original_value != (char *)0x0) {
      pcVar4 = apprun_env_envp_entry_create("APPRUN_ORIGINAL_",paVar1->name,paVar1->original_value);
      ppcVar3[uVar5] = pcVar4;
      uVar5 = (ulong)((int)uVar5 + 1);
    }
    if (paVar1->startup_value != (char *)0x0) {
      pcVar4 = apprun_env_envp_entry_create("APPRUN_STARTUP_",paVar1->name,paVar1->startup_value);
      ppcVar3[uVar5] = pcVar4;
      uVar5 = (ulong)((int)uVar5 + 1);
    }
  }
  return ppcVar3;
}

Assistant:

char **apprun_env_item_list_to_envp(apprun_env_item_list_t *list) {
    unsigned int envp_len = apprun_env_item_list_to_envp_len(list);

    // Allocate an extra space for NULL termination
    char **envp = calloc(envp_len + 1, sizeof(char *));
    unsigned count = 0;

    for (apprun_env_item_list_t *itr = list; *itr != NULL; itr++) {
        apprun_env_item_t *item = *itr;
        if (item->current_value != NULL) {
            char *env_entry = apprun_env_envp_entry_create(NULL, item->name, item->current_value);
            envp[count] = env_entry;
            count++;
        }

        if (item->original_value != NULL) {
            char *env_entry = apprun_env_envp_entry_create(APPRUN_ENV_ORIG_PREFIX, item->name,
                                                           item->original_value);
            envp[count] = env_entry;
            count++;
        }

        if (item->startup_value != NULL) {
            char *env_entry = apprun_env_envp_entry_create(APPRUN_ENV_STARTUP_PREFIX, item->name,
                                                           item->startup_value);
            envp[count] = env_entry;
            count++;
        }
    }

    return envp;
}